

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
__thiscall
duckdb::CreateDuplicateEliminatedJoin
          (duckdb *this,vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
          JoinType join_type,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *original_plan,bool perform_delim)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  const_reference pvVar3;
  pointer pBVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer *__ptr;
  undefined7 in_register_00000081;
  ulong __n;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_80;
  LogicalTypeId local_72;
  JoinType join_type_local;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_70;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_58 [4];
  undefined8 local_38;
  
  local_58[0]._M_head_impl._0_1_ = 0x33;
  join_type_local = join_type;
  local_70._M_head_impl = (LogicalComparisonJoin *)this;
  make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType&,duckdb::LogicalOperatorType>
            (this,&join_type_local,(LogicalOperatorType *)local_58);
  if ((int)CONCAT71(in_register_00000081,perform_delim) == 0) {
    pvVar3 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>(correlated_columns,0);
    make_uniq<duckdb::LogicalWindow,unsigned_long_const&>
              ((duckdb *)&local_88,(unsigned_long *)pvVar3);
    local_72 = 0x7d;
    local_58[0]._M_head_impl = (BoundWindowExpression *)0x0;
    local_38 = 0;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&local_80,&local_72,(void **)&LogicalType::BIGINT,
               &local_58[0]._M_head_impl);
    pBVar4 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_80);
    pBVar4->start = UNBOUNDED_PRECEDING;
    pBVar4 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_80);
    pBVar4->end = CURRENT_ROW_ROWS;
    pBVar4 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_80);
    ::std::__cxx11::string::string((string *)local_58,"delim_index",(allocator *)&local_38);
    ::std::__cxx11::string::operator=
              ((string *)&(pBVar4->super_Expression).super_BaseExpression.alias,(string *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    pLVar5 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
             operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                         *)&local_88);
    local_58[0]._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (BoundWindowExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&(pLVar5->super_LogicalOperator).expressions,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_58);
    if (local_58[0]._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_58[0]._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                ();
    }
    pLVar5 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
             operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                         *)&local_88);
    local_60._M_head_impl =
         (original_plan->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (original_plan->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar5->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_60);
    if (local_60._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_60._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    _Var2._M_head_impl = local_88._M_head_impl;
    local_60._M_head_impl = (LogicalOperator *)0x0;
    local_88._M_head_impl = (LogicalOperator *)0x0;
    _Var1._M_head_impl =
         (original_plan->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (original_plan->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if (local_80._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_80._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    if (local_88._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_88._M_head_impl)->_vptr_LogicalOperator[1])();
    }
  }
  pLVar6 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)local_70._M_head_impl);
  local_68._M_head_impl =
       (original_plan->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (original_plan->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalOperator::AddChild
            ((LogicalOperator *)pLVar6,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_68);
  if (local_68._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_68._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_68._M_head_impl = (LogicalOperator *)0x0;
  for (__n = 0; __n < (ulong)(((long)(correlated_columns->
                                     super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                     ).
                                     super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(correlated_columns->
                                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ).
                                    super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x50);
      __n = __n + 1) {
    pvVar3 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>(correlated_columns,__n);
    pLVar6 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
             ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)local_70._M_head_impl);
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((duckdb *)&local_88,&pvVar3->type,&pvVar3->binding);
    local_58[0]._M_head_impl = (BoundWindowExpression *)local_88._M_head_impl;
    local_88._M_head_impl = (LogicalOperator *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pLVar6->duplicate_eliminated_columns,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_58);
    if (local_58[0]._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_58[0]._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                ();
    }
    local_58[0]._M_head_impl = (BoundWindowExpression *)0x0;
    if (local_88._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_88._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    pLVar6 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
             ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)local_70._M_head_impl);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&(pLVar6->mark_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pvVar3->type);
  }
  return (unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
          )(__uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
            )local_70._M_head_impl;
}

Assistant:

static unique_ptr<LogicalComparisonJoin>
CreateDuplicateEliminatedJoin(const vector<CorrelatedColumnInfo> &correlated_columns, JoinType join_type,
                              unique_ptr<LogicalOperator> original_plan, bool perform_delim) {
	auto delim_join = make_uniq<LogicalComparisonJoin>(join_type, LogicalOperatorType::LOGICAL_DELIM_JOIN);
	if (!perform_delim) {
		// if we are not performing a delim join, we push a row_number() OVER() window operator on the LHS
		// and perform all duplicate elimination on that row number instead
		D_ASSERT(correlated_columns[0].type.id() == LogicalTypeId::BIGINT);
		auto window = make_uniq<LogicalWindow>(correlated_columns[0].binding.table_index);
		auto row_number =
		    make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_ROW_NUMBER, LogicalType::BIGINT, nullptr, nullptr);
		row_number->start = WindowBoundary::UNBOUNDED_PRECEDING;
		row_number->end = WindowBoundary::CURRENT_ROW_ROWS;
		row_number->SetAlias("delim_index");
		window->expressions.push_back(std::move(row_number));
		window->AddChild(std::move(original_plan));
		original_plan = std::move(window);
	}
	delim_join->AddChild(std::move(original_plan));
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		auto &col = correlated_columns[i];
		delim_join->duplicate_eliminated_columns.push_back(make_uniq<BoundColumnRefExpression>(col.type, col.binding));
		delim_join->mark_types.push_back(col.type);
	}
	return delim_join;
}